

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedNumberFormat::RuleBasedNumberFormat
          (RuleBasedNumberFormat *this,RuleBasedNumberFormat *rhs)

{
  NumberFormat::NumberFormat(&this->super_NumberFormat,&rhs->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedNumberFormat_003d70e0;
  this->defaultRuleSet = (NFRuleSet *)0x0;
  this->fRuleSets = (NFRuleSet **)0x0;
  this->ruleSetDescriptions = (UnicodeString *)0x0;
  this->numRuleSets = 0;
  Locale::Locale(&this->locale,&rhs->locale);
  this->defaultInfinityRule = (NFRule *)0x0;
  this->defaultNaNRule = (NFRule *)0x0;
  this->collator = (RuleBasedCollator *)0x0;
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  this->fRoundingMode = kRoundUnnecessary;
  this->lenient = '\0';
  this->lenientParseRules = (UnicodeString *)0x0;
  this->localizations = (LocalizationInfo *)0x0;
  (this->originalDescription).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->originalDescription).fUnion.fStackFields.fLengthAndFlags = 2;
  this->capitalizationInfoSet = '\0';
  this->capitalizationForUIListMenu = '\0';
  this->capitalizationForStandAlone = '\0';
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  operator=(this,rhs);
  return;
}

Assistant:

RuleBasedNumberFormat::RuleBasedNumberFormat(const RuleBasedNumberFormat& rhs)
  : NumberFormat(rhs)
  , fRuleSets(NULL)
  , ruleSetDescriptions(NULL)
  , numRuleSets(0)
  , defaultRuleSet(NULL)
  , locale(rhs.locale)
  , collator(NULL)
  , decimalFormatSymbols(NULL)
  , defaultInfinityRule(NULL)
  , defaultNaNRule(NULL)
  , fRoundingMode(DecimalFormat::ERoundingMode::kRoundUnnecessary)
  , lenient(FALSE)
  , lenientParseRules(NULL)
  , localizations(NULL)
  , capitalizationInfoSet(FALSE)
  , capitalizationForUIListMenu(FALSE)
  , capitalizationForStandAlone(FALSE)
  , capitalizationBrkIter(NULL)
{
    this->operator=(rhs);
}